

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

void __thiscall
Fixpp::impl::
MessageVisitor<should_be_able_to_return_value_in_visitor::Visitor,DefaultTestRules<Fixpp::v42::Spec::Dictionary>>
::
handleUnknownTag<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)75>,Fixpp::Required<Fixpp::TagT<66u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<60u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>,Fixpp::TypedParsingContext<int>>
          (undefined8 param_1,undefined8 *valueToken,long message,undefined8 param_4,undefined4 tag)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  undefined4 *puVar5;
  
  lVar1 = valueToken[1];
  lVar2 = *(long *)(*(long *)*valueToken + 8);
  lVar3 = *(long *)(*(long *)*valueToken + 0x10);
  uVar4 = valueToken[3];
  if (*(ulong *)(message + 0x70) <= *(ulong *)(message + 0x68)) {
    llvm::
    SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
    ::grow((SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>::Unparsed,_false>
            *)(message + 0x60),0);
  }
  puVar5 = *(undefined4 **)(message + 0x68);
  *puVar5 = tag;
  *(undefined8 *)(puVar5 + 2) = uVar4;
  *(long *)(puVar5 + 4) = lVar3 - (lVar1 + lVar2);
  *(long *)(message + 0x68) = *(long *)(message + 0x68) + 0x18;
  return;
}

Assistant:

void handleUnknownTag(const StreamCursor::Token& valueToken, Message& message, Context& /*context*/, int tag,
                                  BoolPack<false, false>)
            {
                message.unparsed.emplace_back(tag, valueToken.view());
            }